

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf.h
# Opt level: O2

void __thiscall server::ctfservmode::setupholdspawns(ctfservmode *this)

{
  int i;
  flag *pfVar1;
  bool bVar2;
  long lVar3;
  anon_union_12_3_07544735_for_vec_0 local_40;
  
  if (((gamemode + 3U < 0x1a) && ((0x4c0000UL >> ((ulong)(gamemode + 3U) & 0x3f) & 1) != 0)) &&
     ((this->holdspawns).ulen != 0)) {
    while( true ) {
      i = (this->flags).ulen;
      lVar3 = (long)i;
      if (0 < lVar3) break;
      local_40._0_8_ = 0;
      local_40.field_0.z = 0.0;
      bVar2 = addflag(this,i,(vec *)&local_40.field_0,0,0);
      if (!bVar2) {
        return;
      }
      pfVar1 = (this->flags).buf;
      spawnflag(this,i);
      pfVar1[lVar3].version = pfVar1[lVar3].version + 1;
      sendf(-1,1,"ri6");
    }
  }
  return;
}

Assistant:

void setupholdspawns()
    {
        if(!m_hold || holdspawns.empty()) return;
        while(flags.length() < HOLDFLAGS)
        {
            int i = flags.length();
            if(!addflag(i, vec(0, 0, 0), 0, 0)) break;
            flag &f = flags[i];
            spawnflag(i);
            sendf(-1, 1, "ri6", N_RESETFLAG, i, ++f.version, f.spawnindex, 0, 0);
        }
    }